

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type1Input.cpp
# Opt level: O0

EStatusCode __thiscall
Type1Input::CalculateDependenciesForCharIndex
          (Type1Input *this,Byte inCharStringIndex,CharString1Dependencies *ioDependenciesInfo)

{
  Type1CharString *inCharStringToIntepret;
  Trace *this_00;
  EStatusCode status;
  Type1CharString *charString;
  CharStringType1Interpreter interpreter;
  CharString1Dependencies *ioDependenciesInfo_local;
  Byte inCharStringIndex_local;
  Type1Input *this_local;
  
  interpreter._64_8_ = ioDependenciesInfo;
  CharStringType1Interpreter::CharStringType1Interpreter((CharStringType1Interpreter *)&charString);
  inCharStringToIntepret = GetGlyphCharString(this,inCharStringIndex);
  if (inCharStringToIntepret == (Type1CharString *)0x0) {
    this_00 = Trace::DefaultTrace();
    Trace::TraceToLog(this_00,
                      "Type1Input::CalculateDependenciesForCharIndex, Exception, cannot find glyph index"
                     );
    this_local._4_4_ = eFailure;
  }
  else {
    this->mCurrentDependencies = (CharString1Dependencies *)interpreter._64_8_;
    this_local._4_4_ =
         CharStringType1Interpreter::Intepret
                   ((CharStringType1Interpreter *)&charString,inCharStringToIntepret,
                    (IType1InterpreterImplementation *)this);
    this->mCurrentDependencies = (CharString1Dependencies *)0x0;
  }
  CharStringType1Interpreter::~CharStringType1Interpreter((CharStringType1Interpreter *)&charString)
  ;
  return this_local._4_4_;
}

Assistant:

EStatusCode Type1Input::CalculateDependenciesForCharIndex(	Byte inCharStringIndex,
															CharString1Dependencies& ioDependenciesInfo)
{
	CharStringType1Interpreter interpreter;

	Type1CharString* charString = GetGlyphCharString(inCharStringIndex);
	if(!charString)
	{
		TRACE_LOG("Type1Input::CalculateDependenciesForCharIndex, Exception, cannot find glyph index");
		return eFailure;
	}

	mCurrentDependencies = &ioDependenciesInfo;
	EStatusCode status = interpreter.Intepret(*charString,this);
	mCurrentDependencies = NULL;
	return status;
}